

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O1

void __thiscall xmrig::Hashrate::Hashrate(Hashrate *this,size_t threads)

{
  uint64_t **ppuVar1;
  uint32_t *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  size_t sVar5;
  
  this->m_threads = threads;
  uVar4 = -(ulong)(threads >> 0x3d != 0) | threads * 8;
  ppuVar1 = (uint64_t **)operator_new__(uVar4);
  this->m_counts = ppuVar1;
  ppuVar1 = (uint64_t **)operator_new__(uVar4);
  this->m_timestamps = ppuVar1;
  puVar2 = (uint32_t *)operator_new__(-(ulong)(threads >> 0x3e != 0) | threads * 4);
  this->m_top = puVar2;
  if (threads != 0) {
    sVar5 = 0;
    do {
      puVar3 = (uint64_t *)operator_new__(0x8000);
      memset(puVar3,0,0x8000);
      this->m_counts[sVar5] = puVar3;
      puVar3 = (uint64_t *)operator_new__(0x8000);
      memset(puVar3,0,0x8000);
      this->m_timestamps[sVar5] = puVar3;
      this->m_top[sVar5] = 0;
      sVar5 = sVar5 + 1;
    } while (threads != sVar5);
  }
  return;
}

Assistant:

xmrig::Hashrate::Hashrate(size_t threads) :
    m_threads(threads)
{
    m_counts     = new uint64_t*[threads];
    m_timestamps = new uint64_t*[threads];
    m_top        = new uint32_t[threads];

    for (size_t i = 0; i < threads; i++) {
        m_counts[i]     = new uint64_t[kBucketSize]();
        m_timestamps[i] = new uint64_t[kBucketSize]();
        m_top[i]        = 0;
    }
}